

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O3

int xcb_input_feedback_state_data_serialize
              (void **_buffer,uint8_t class_id,xcb_input_feedback_state_data_t *_aux)

{
  uint uVar1;
  long *plVar2;
  void *__dest;
  long lVar3;
  int iVar4;
  int iVar5;
  undefined7 in_register_00000031;
  ulong uVar6;
  int iVar7;
  long in_FS_OFFSET;
  char xcb_pad0 [3];
  iovec xcb_parts [27];
  uint local_1e0;
  undefined1 local_1dc [4];
  xcb_input_feedback_state_data_t *local_1d8;
  ulong local_1d0;
  uint32_t *local_1c8;
  long local_1c0;
  uint32_t *local_1b8;
  long local_1b0;
  uint32_t *local_1a8;
  long local_1a0;
  uint8_t *local_198;
  undefined8 local_190;
  anon_struct_8_2_3f0cf693_for_led local_188;
  anon_struct_8_4_64ea3a00_for_bell local_180;
  uint8_t *local_178;
  undefined8 local_170;
  uint *local_168;
  undefined8 local_160;
  uint8_t *local_158;
  long local_150 [37];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  __dest = *_buffer;
  local_1dc[2] = 0;
  local_1dc._0_2_ = 0;
  memset(&local_1d8,0xaa,0x1b0);
  switch(CONCAT71(in_register_00000031,class_id) & 0xffffffff) {
  case 0:
    plVar2 = local_150;
    local_1d8 = _aux;
    local_1d0 = 2;
    local_1c8 = (uint32_t *)&(_aux->keyboard).duration;
    local_1c0 = 2;
    local_1b8 = &(_aux->keyboard).led_mask;
    local_1b0 = 4;
    local_1a8 = &(_aux->keyboard).led_values;
    local_1a0 = 4;
    local_198 = &(_aux->keyboard).global_auto_repeat;
    local_190._0_4_ = 1;
    local_190._4_4_ = 0;
    local_188 = (anon_struct_8_2_3f0cf693_for_led)&(_aux->keyboard).click;
    local_180.percent = '\x01';
    local_180.pad2[0] = '\0';
    local_180.pad2[1] = '\0';
    local_180.pad2[2] = '\0';
    local_180.pitch = 0;
    local_180.duration = 0;
    local_178 = &(_aux->keyboard).percent;
    local_170 = 1;
    local_168 = &local_1e0;
    local_160 = 1;
    local_158 = (_aux->keyboard).auto_repeats;
    iVar4 = 0x30;
    iVar7 = 9;
    iVar5 = 0;
    lVar3 = 0x20;
    uVar1 = 0;
    break;
  case 1:
    plVar2 = &local_1a0;
    local_1d8 = (xcb_input_feedback_state_data_t *)local_1dc;
    lVar3 = 2;
    local_1d0 = 2;
    local_1c8 = (uint32_t *)&(_aux->pointer).accel_num;
    local_1c0 = 2;
    local_1b8 = (uint32_t *)&(_aux->pointer).accel_denom;
    local_1b0 = 2;
    local_1a8 = (uint32_t *)&(_aux->pointer).threshold;
    iVar4 = 8;
    iVar7 = 4;
    uVar1 = 1;
    iVar5 = 0;
    break;
  case 2:
    plVar2 = &local_1b0;
    local_1d8 = (xcb_input_feedback_state_data_t *)&_aux->string;
    local_1d0 = 2;
    local_1c8 = (uint32_t *)&(_aux->string).num_keysyms;
    local_1c0 = 2;
    local_1b8 = (_aux->string).keysyms;
    lVar3 = (ulong)(_aux->string).num_keysyms << 2;
    iVar4 = (int)lVar3;
    uVar1 = 3;
    iVar5 = 4;
    iVar7 = 3;
    break;
  case 3:
    plVar2 = &local_1b0;
    local_1d8 = (xcb_input_feedback_state_data_t *)&_aux->integer;
    lVar3 = 4;
    local_1d0 = 4;
    local_1c8 = (uint32_t *)&(_aux->integer).min_value;
    local_1c0 = 4;
    local_1b8 = (uint32_t *)&(_aux->integer).max_value;
    iVar4 = 0xc;
    uVar1 = 3;
    iVar5 = 0;
    iVar7 = 3;
    break;
  case 4:
    plVar2 = &local_1c0;
    local_1d8 = (xcb_input_feedback_state_data_t *)&_aux->led;
    local_1d0 = 4;
    local_1c8 = &(_aux->led).led_values;
    iVar4 = 8;
    iVar7 = 2;
    uVar1 = 3;
    iVar5 = 0;
    lVar3 = 4;
    break;
  case 5:
    plVar2 = &local_1a0;
    local_1d8 = (xcb_input_feedback_state_data_t *)&_aux->bell;
    local_1d0 = 1;
    local_1c8 = (uint32_t *)local_1dc;
    local_1c0 = 3;
    local_1b8 = (uint32_t *)&(_aux->bell).pitch;
    local_1b0 = 2;
    local_1a8 = (uint32_t *)&(_aux->bell).duration;
    iVar4 = 8;
    iVar7 = 4;
    uVar1 = 1;
    iVar5 = 0;
    lVar3 = 2;
    break;
  default:
    uVar1 = 0xffffffff;
    iVar5 = 0;
    iVar7 = 0;
    iVar4 = 0;
    goto LAB_00186cfa;
  }
  *plVar2 = lVar3;
LAB_00186cfa:
  uVar1 = -iVar4 & uVar1;
  local_1e0 = uVar1;
  if (uVar1 != 0) {
    *(undefined1 **)((long)&local_1d8 + (ulong)(uint)(iVar7 << 4)) = local_1dc;
    *(ulong *)((long)&local_1d0 + (ulong)(uint)(iVar7 << 4)) = (ulong)uVar1;
    iVar7 = iVar7 + 1;
    local_1e0 = 0;
  }
  uVar1 = iVar5 + iVar4 + uVar1;
  if (__dest == (void *)0x0) {
    __dest = malloc((ulong)uVar1);
    *_buffer = __dest;
  }
  if (iVar7 != 0) {
    uVar6 = 0;
    do {
      if ((*(void **)((long)&local_1d8 + uVar6) != (void *)0x0) &&
         (*(size_t *)((long)&local_1d0 + uVar6) != 0)) {
        memcpy(__dest,*(void **)((long)&local_1d8 + uVar6),*(size_t *)((long)&local_1d0 + uVar6));
      }
      __dest = (void *)((long)__dest + *(long *)((long)&local_1d0 + uVar6));
      uVar6 = uVar6 + 0x10;
    } while ((uint)(iVar7 << 4) != uVar6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return uVar1;
}

Assistant:

int
xcb_input_feedback_state_data_serialize (void                                  **_buffer,
                                         uint8_t                                 class_id,
                                         const xcb_input_feedback_state_data_t  *_aux)
{
    char *xcb_out = *_buffer;
    unsigned int xcb_buffer_len = 0;
    unsigned int xcb_align_to = 0;
    unsigned int xcb_padding_offset = 0;

    unsigned int xcb_pad = 0;
    char xcb_pad0[3] = {0, 0, 0};
    struct iovec xcb_parts[27];
    unsigned int xcb_parts_idx = 0;
    unsigned int xcb_block_len = 0;
    unsigned int i;
    char *xcb_tmp;

    if(class_id == XCB_INPUT_FEEDBACK_CLASS_KEYBOARD) {
        /* xcb_input_feedback_state_data_t.keyboard.pitch */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.pitch;
        xcb_block_len += sizeof(uint16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint16_t);
        /* xcb_input_feedback_state_data_t.keyboard.duration */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.duration;
        xcb_block_len += sizeof(uint16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint16_t);
        /* xcb_input_feedback_state_data_t.keyboard.led_mask */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.led_mask;
        xcb_block_len += sizeof(uint32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint32_t);
        /* xcb_input_feedback_state_data_t.keyboard.led_values */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.led_values;
        xcb_block_len += sizeof(uint32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint32_t);
        /* xcb_input_feedback_state_data_t.keyboard.global_auto_repeat */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.global_auto_repeat;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_feedback_state_data_t.keyboard.click */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.click;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_feedback_state_data_t.keyboard.percent */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.percent;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_feedback_state_data_t.keyboard.pad0 */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &xcb_pad;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_feedback_state_data_t.keyboard.auto_repeats */
        xcb_parts[xcb_parts_idx].iov_base = (char *) _aux->keyboard.auto_repeats;
        xcb_block_len += 32;
        xcb_parts[xcb_parts_idx].iov_len = 32;
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
    }
    if(class_id == XCB_INPUT_FEEDBACK_CLASS_POINTER) {
        /* xcb_input_feedback_state_data_t.pointer.pad1 */
        xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
        xcb_block_len += sizeof(uint8_t)*2;
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t)*2;
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_feedback_state_data_t.pointer.accel_num */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->pointer.accel_num;
        xcb_block_len += sizeof(uint16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint16_t);
        /* xcb_input_feedback_state_data_t.pointer.accel_denom */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->pointer.accel_denom;
        xcb_block_len += sizeof(uint16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint16_t);
        /* xcb_input_feedback_state_data_t.pointer.threshold */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->pointer.threshold;
        xcb_block_len += sizeof(uint16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint16_t);
    }
    if(class_id == XCB_INPUT_FEEDBACK_CLASS_STRING) {
        /* xcb_input_feedback_state_data_t.string.max_symbols */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->string.max_symbols;
        xcb_block_len += sizeof(uint16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint16_t);
        /* xcb_input_feedback_state_data_t.string.num_keysyms */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->string.num_keysyms;
        xcb_block_len += sizeof(uint16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint16_t);
        /* insert padding */
        xcb_pad = -(xcb_block_len + xcb_padding_offset) & (xcb_align_to - 1);
        xcb_buffer_len += xcb_block_len + xcb_pad;
        if (0 != xcb_pad) {
            xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
            xcb_parts[xcb_parts_idx].iov_len = xcb_pad;
            xcb_parts_idx++;
            xcb_pad = 0;
        }
        xcb_block_len = 0;
        xcb_padding_offset = 0;
        /* keysyms */
        xcb_parts[xcb_parts_idx].iov_base = (char *) _aux->string.keysyms;
        xcb_block_len += _aux->string.num_keysyms * sizeof(uint32_t);
        xcb_parts[xcb_parts_idx].iov_len = _aux->string.num_keysyms * sizeof(uint32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(xcb_keysym_t);
    }
    if(class_id == XCB_INPUT_FEEDBACK_CLASS_INTEGER) {
        /* xcb_input_feedback_state_data_t.integer.resolution */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->integer.resolution;
        xcb_block_len += sizeof(uint32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint32_t);
        /* xcb_input_feedback_state_data_t.integer.min_value */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->integer.min_value;
        xcb_block_len += sizeof(int32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int32_t);
        /* xcb_input_feedback_state_data_t.integer.max_value */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->integer.max_value;
        xcb_block_len += sizeof(int32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int32_t);
    }
    if(class_id == XCB_INPUT_FEEDBACK_CLASS_LED) {
        /* xcb_input_feedback_state_data_t.led.led_mask */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->led.led_mask;
        xcb_block_len += sizeof(uint32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint32_t);
        /* xcb_input_feedback_state_data_t.led.led_values */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->led.led_values;
        xcb_block_len += sizeof(uint32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint32_t);
    }
    if(class_id == XCB_INPUT_FEEDBACK_CLASS_BELL) {
        /* xcb_input_feedback_state_data_t.bell.percent */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->bell.percent;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_feedback_state_data_t.bell.pad2 */
        xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
        xcb_block_len += sizeof(uint8_t)*3;
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t)*3;
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_feedback_state_data_t.bell.pitch */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->bell.pitch;
        xcb_block_len += sizeof(uint16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint16_t);
        /* xcb_input_feedback_state_data_t.bell.duration */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->bell.duration;
        xcb_block_len += sizeof(uint16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint16_t);
    }
    /* insert padding */
    xcb_pad = -(xcb_block_len + xcb_padding_offset) & (xcb_align_to - 1);
    xcb_buffer_len += xcb_block_len + xcb_pad;
    if (0 != xcb_pad) {
        xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
        xcb_parts[xcb_parts_idx].iov_len = xcb_pad;
        xcb_parts_idx++;
        xcb_pad = 0;
    }
    xcb_block_len = 0;
    xcb_padding_offset = 0;

    if (NULL == xcb_out) {
        /* allocate memory */
        xcb_out = malloc(xcb_buffer_len);
        *_buffer = xcb_out;
    }

    xcb_tmp = xcb_out;
    for(i=0; i<xcb_parts_idx; i++) {
        if (0 != xcb_parts[i].iov_base && 0 != xcb_parts[i].iov_len)
            memcpy(xcb_tmp, xcb_parts[i].iov_base, xcb_parts[i].iov_len);
        if (0 != xcb_parts[i].iov_len)
            xcb_tmp += xcb_parts[i].iov_len;
    }

    return xcb_buffer_len;
}